

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Cnf_GiaSolveOne(Gia_Man_t *p,Cnf_Dat_t *pCnf,int nTimeOut,int *pnVars,int *pnConfs)

{
  int iVar1;
  int iVar2;
  sat_solver *s;
  Abc_Cex_t *pAVar3;
  sat_solver *pSat;
  int status;
  int *pnConfs_local;
  int *pnVars_local;
  int nTimeOut_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *p_local;
  
  s = Cec_GiaDeriveSolver(p,pCnf,nTimeOut);
  if (s == (sat_solver *)0x0) {
    *pnVars = 0;
    *pnConfs = 0;
    p_local._4_4_ = 1;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    iVar2 = sat_solver_nvars(s);
    *pnVars = iVar2;
    iVar2 = sat_solver_nconflicts(s);
    *pnConfs = iVar2;
    if (iVar1 == 1) {
      pAVar3 = Cec_SplitDeriveModel(p,pCnf,s);
      p->pCexComb = pAVar3;
    }
    sat_solver_delete(s);
    if (iVar1 == 0) {
      p_local._4_4_ = -1;
    }
    else if (iVar1 == -1) {
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int Cnf_GiaSolveOne( Gia_Man_t * p, Cnf_Dat_t * pCnf, int nTimeOut, int * pnVars, int * pnConfs )
{
    int status;
    sat_solver * pSat = Cec_GiaDeriveSolver( p, pCnf, nTimeOut );
    if ( pSat == NULL )
    {
        *pnVars = 0;
        *pnConfs = 0;
        return 1;
    }
    status   = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    *pnVars  = sat_solver_nvars( pSat );
    *pnConfs = sat_solver_nconflicts( pSat );
    if ( status == l_True )
        p->pCexComb = Cec_SplitDeriveModel( p, pCnf, pSat );
    sat_solver_delete( pSat );
    if ( status == l_Undef )
        return -1;
    if ( status == l_False )
        return 1;
    return 0;
}